

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

unsigned_short ndiGetBX2PortStatus(ndicapi *pol,int portHandle)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = pol->Bx2HandleCount;
  uVar2 = 0;
  if ((long)(int)uVar1 < 1) {
LAB_0010a5cb:
    if ((uint)uVar2 != uVar1) {
      return pol->Bx2HandlesStatus[uVar2 & 0xffffffff];
    }
  }
  else {
    do {
      if ((uint)pol->Bx2Handles[uVar2] == portHandle) goto LAB_0010a5cb;
      uVar2 = uVar2 + 1;
    } while ((long)(int)uVar1 != uVar2);
  }
  return 0;
}

Assistant:

ndicapiExport unsigned short ndiGetBX2PortStatus(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->Bx2HandlesStatus[i];
}